

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O1

void __thiscall
DelaunayMST::DelaunayMST(DelaunayMST *this,vector<Point2d,_std::allocator<Point2d>_> *points)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer pPVar5;
  pointer pPVar6;
  pointer pEVar7;
  pointer pEVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined8 uVar13;
  EListNode *__s;
  long lVar14;
  int *piVar15;
  Point2d *pPVar16;
  void *__s_00;
  undefined4 *puVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  Point2d *pPVar21;
  long lVar22;
  ulong uVar23;
  double dVar24;
  
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_KruskalMST).edges.
  super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar5 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar6 = (points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar23 = ((long)pPVar6 - (long)pPVar5) * 2 + 0x20;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar23;
  uVar20 = 0xffffffffffffffff;
  if (SUB168(auVar10 * ZEXT816(0xc),8) == 0) {
    uVar20 = SUB168(auVar10 * ZEXT816(0xc),0);
  }
  __s = (EListNode *)operator_new__(uVar20);
  if (uVar23 != 0) {
    memset(__s,0,(((long)pPVar6 * 0x18 + (long)pPVar5 * -0x18 + 0x174U) / 0xc) * 0xc + 0xc);
  }
  (this->e)._M_t.
  super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>._M_t
  .super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>.
  super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl = __s;
  lVar14 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar23 = -(ulong)(lVar14 + 1U >> 0x3e != 0) | lVar14 * 4 + 4U;
  piVar15 = (int *)operator_new__(uVar23);
  memset(piVar15,0,uVar23);
  (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar15;
  lVar14 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  uVar23 = 0xffffffffffffffff;
  if (lVar14 + 1U < 0x4000000000000000) {
    uVar23 = lVar14 * 4 + 4;
  }
  piVar15 = (int *)operator_new__(uVar23);
  memset(piVar15,0,uVar23);
  (this->stk)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar15;
  uVar23 = ((long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 4) + 1;
  uVar23 = -(ulong)(uVar23 >> 0x3c != 0) | uVar23 * 0x10;
  pPVar16 = (Point2d *)operator_new__(uVar23);
  memset(pPVar16,0,uVar23);
  (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
  super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
  super__Head_base<0UL,_Point2d_*,_false>._M_head_impl = pPVar16;
  this->eCnt = 1;
  lVar14 = (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  (this->super_KruskalMST).n = (int)lVar14;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = lVar14 + 1;
  uVar23 = 0xffffffffffffffff;
  if (SUB168(auVar11 * ZEXT816(0x18),8) == 0) {
    uVar23 = SUB168(auVar11 * ZEXT816(0x18),0);
  }
  __s_00 = operator_new__(uVar23);
  memset(__s_00,0,uVar23);
  iVar19 = (this->super_KruskalMST).n;
  if (0 < iVar19) {
    puVar17 = (undefined4 *)((long)__s_00 + 0x28);
    lVar14 = 0;
    lVar18 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)&((points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                        super__Vector_impl_data._M_start)->x + lVar14);
      uVar13 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(this->p)._M_t.
                       super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
                       super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                       super__Head_base<0UL,_Point2d_*,_false>._M_head_impl[1].x + lVar14);
      *puVar2 = *puVar1;
      puVar2[1] = uVar13;
      puVar1 = (undefined8 *)
               ((long)&((points->super__Vector_base<Point2d,_std::allocator<Point2d>_>)._M_impl.
                        super__Vector_impl_data._M_start)->x + lVar14);
      uVar13 = puVar1[1];
      *(undefined8 *)(puVar17 + -4) = *puVar1;
      *(undefined8 *)(puVar17 + -2) = uVar13;
      lVar18 = lVar18 + 1;
      *puVar17 = (int)lVar18;
      iVar19 = (this->super_KruskalMST).n;
      lVar14 = lVar14 + 0x10;
      puVar17 = puVar17 + 6;
    } while (lVar18 < iVar19);
  }
  if (iVar19 != 0) {
    pPVar16 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
              super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
              super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
    pPVar21 = pPVar16 + (long)iVar19 + 1;
    pPVar16 = pPVar16 + 1;
    uVar23 = (long)pPVar21 - (long)pPVar16 >> 4;
    lVar14 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<Point2d*,long,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (pPVar16,pPVar21,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Point2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::DelaunayMST(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (pPVar16,pPVar21);
  }
  lVar14 = (long)(this->super_KruskalMST).n;
  if (lVar14 != 0) {
    lVar18 = (long)__s_00 + 0x18;
    lVar22 = (long)__s_00 + lVar14 * 0x18 + 0x18;
    uVar23 = (lVar22 - lVar18 >> 3) * -0x5555555555555555;
    lVar14 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<DelaunayMST::IndexPoint2d*,long,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::_Iter_comp_iter(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (lVar18,lVar22,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<DelaunayMST::IndexPoint2d*,__gnu_cxx::__ops::_Iter_comp_iter<DelaunayMST::_Iter_comp_iter(std::vector<Point2d,std::allocator<Point2d>>const&)::_lambda(auto:1&,auto:2&)_1_>>
              (lVar18,lVar22);
  }
  delaunay(this,1,(this->super_KruskalMST).n);
  if (0 < (this->super_KruskalMST).n) {
    lVar14 = 1;
    do {
      iVar19 = (this->last)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar14];
      if (iVar19 != 0) {
        do {
          iVar3 = *(int *)((long)__s_00 + lVar14 * 0x18 + 0x10);
          pPVar16 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>.
                    _M_t.super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
                    super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
          lVar18 = (long)(this->e)._M_t.
                         super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                         .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl
                         [iVar19].to;
          iVar4 = *(int *)((long)__s_00 + lVar18 * 0x18 + 0x10);
          dVar12 = pPVar16[lVar14].x - pPVar16[lVar18].x;
          dVar24 = pPVar16[lVar14].y - pPVar16[lVar18].y;
          dVar12 = dVar12 * dVar12 + dVar24 * dVar24;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          KruskalMST::addEdge(&this->super_KruskalMST,iVar3 + -1,iVar4 + -1,dVar12);
          iVar19 = (this->e)._M_t.
                   super___uniq_ptr_impl<DelaunayMST::EListNode,_std::default_delete<DelaunayMST::EListNode[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_DelaunayMST::EListNode_*,_std::default_delete<DelaunayMST::EListNode[]>_>
                   .super__Head_base<0UL,_DelaunayMST::EListNode_*,_false>._M_head_impl[iVar19].prev
          ;
        } while (iVar19 != 0);
      }
      bVar9 = lVar14 < (this->super_KruskalMST).n;
      lVar14 = lVar14 + 1;
    } while (bVar9);
  }
  pEVar7 = (this->super_KruskalMST).edges.
           super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar8 = (this->super_KruskalMST).edges.
           super__Vector_base<KruskalMST::Edge,_std::allocator<KruskalMST::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar7 != pEVar8) {
    uVar23 = (long)pEVar8 - (long)pEVar7 >> 4;
    lVar14 = 0x3f;
    if (uVar23 != 0) {
      for (; uVar23 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar7,pEVar8,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<KruskalMST::Edge*,std::vector<KruskalMST::Edge,std::allocator<KruskalMST::Edge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar7,pEVar8);
  }
  operator_delete__(__s_00);
  return;
}

Assistant:

DelaunayMST(const std::vector<Point2d> &points)
			: last(new int[points.size() + 1]{}), stk(new int[points.size() + 1]{}),
			  p(new Point2d[points.size() + 1]{}), e(new EListNode[(points.size() + 1) * 32]{})
	{
		n = static_cast<int>(points.size());
		std::unique_ptr<IndexPoint2d[]> ori(new IndexPoint2d[points.size() + 1]{});
		for (int i = 1; i <= n; ++i)
			p[i] = points[i - 1], ori[i] = {points[i - 1], i};

		auto pointCmp = [](auto &lhs, auto &rhs)
		{ return lhs.x < rhs.x || lhs.x == rhs.x && lhs.y < rhs.y; };
		std::sort(p.get() + 1, p.get() + 1 + n, pointCmp);
		std::sort(ori.get() + 1, ori.get() + 1 + n, pointCmp);

		delaunay(1, n);

		for (int i = 1; i <= n; ++i)
			for (int j = last[i]; j; j = e[j].prev)
				addEdge(ori[i].index - 1, ori[e[j].to].index - 1, (p[i] - p[e[j].to]).length());
		std::sort(edges.begin(), edges.end());
	}